

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O0

void __thiscall
FC_BPNN::predict(FC_BPNN *this,vector<double,_std::allocator<double>_> *data,
                vector<double,_std::allocator<double>_> *prediction)

{
  size_type sVar1;
  reference __x;
  int lastIndex;
  vector<double,_std::allocator<double>_> *prediction_local;
  vector<double,_std::allocator<double>_> *data_local;
  FC_BPNN *this_local;
  
  clear(this);
  setSample(this,data);
  Forward(this);
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->layers_value);
  __x = std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](&this->layers_value,(long)((int)sVar1 + -1));
  std::vector<double,_std::allocator<double>_>::operator=(prediction,__x);
  return;
}

Assistant:

void FC_BPNN::predict(const std::vector<double>& data, std::vector<double>& prediction)
{
	clear();
	setSample(data);
	Forward();
	int lastIndex = layers_value.size() - 1;
	prediction = layers_value[lastIndex];
}